

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int pack_bs_worker_hook(void *arg1,void *arg2)

{
  int iVar1;
  aom_write_bit_buffer *paVar2;
  pthread_mutex_t *__mutex;
  int iVar3;
  PackBSParams *in_RDI;
  AV1_COMP *unaff_retaddr;
  TileDataEnc *this_tile;
  int tile_idx;
  aom_internal_error_info *error_info;
  MACROBLOCKD *xd;
  pthread_mutex_t *pack_bs_mutex;
  int num_tiles;
  CommonTileParams *tiles;
  AV1EncPackBSSync *pack_bs_sync;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  PackBSParams *pack_bs_params;
  EncWorkerData *thread_data;
  int local_7c;
  PackBSParams *pack_bs_params_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  paVar2 = in_RDI->saved_wb;
  iVar4 = *(int *)&paVar2[0x4202].bit_buffer;
  iVar1 = *(int *)((long)&paVar2[0x4202].bit_buffer + 4);
  __mutex = *(pthread_mutex_t **)&paVar2[0x9b11].bit_offset;
  *(uint32_t ***)((in_RDI->buf).data + 0x2b90) = &in_RDI->total_size;
  pack_bs_params_00 = in_RDI;
  iVar3 = _setjmp((__jmp_buf_tag *)&in_RDI[2].curr_tg_hdr_size);
  if (iVar3 == 0) {
    *(undefined4 *)&in_RDI[2].obu_extn_header = 1;
    while( true ) {
      pthread_mutex_lock(__mutex);
      if (((ulong)paVar2[0x9d12].bit_buffer & 0x100000000) == 0) {
        local_7c = get_next_pack_bs_tile_idx
                             ((AV1EncPackBSSync *)&paVar2[0x9b11].bit_offset,iVar4 * iVar1);
      }
      else {
        local_7c = -1;
      }
      pthread_mutex_unlock(__mutex);
      if (local_7c == -1) break;
      *(long *)((in_RDI->buf).data + 0x2b38) =
           *(long *)&paVar2[0x7131].bit_offset + (long)local_7c * 0x5d10 + 0x20;
      av1_pack_tile_info(unaff_retaddr,
                         (ThreadData *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,pack_bs_params_00);
    }
    *(undefined4 *)&in_RDI[2].obu_extn_header = 0;
    iVar4 = 1;
  }
  else {
    *(undefined4 *)&in_RDI[2].obu_extn_header = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)&paVar2[0x9d12].bit_buffer + 4) = 1;
    pthread_mutex_unlock(__mutex);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int pack_bs_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  PackBSParams *const pack_bs_params = (PackBSParams *)arg2;
  AV1_COMP *const cpi = thread_data->cpi;
  AV1_COMMON *const cm = &cpi->common;
  AV1EncPackBSSync *const pack_bs_sync = &cpi->mt_info.pack_bs_sync;
  const CommonTileParams *const tiles = &cm->tiles;
  const int num_tiles = tiles->cols * tiles->rows;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *const pack_bs_mutex = pack_bs_sync->mutex_;
#endif
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pack_bs_mutex);
    pack_bs_sync->pack_bs_mt_exit = true;
    pthread_mutex_unlock(pack_bs_mutex);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  while (1) {
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pack_bs_mutex);
#endif
    const int tile_idx =
        pack_bs_sync->pack_bs_mt_exit
            ? -1
            : get_next_pack_bs_tile_idx(pack_bs_sync, num_tiles);
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pack_bs_mutex);
#endif
    // When pack_bs_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (tile_idx == -1) break;
    TileDataEnc *this_tile = &cpi->tile_data[tile_idx];
    thread_data->td->mb.e_mbd.tile_ctx = &this_tile->tctx;

    av1_pack_tile_info(cpi, thread_data->td, &pack_bs_params[tile_idx]);
  }

  error_info->setjmp = 0;
  return 1;
}